

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tr1::tuple<testing::Matcher<int*>,testing::Matcher<unsigned_long>,void,void,void,void,void,void,void,void>,std::tr1::tuple<int*,unsigned_long,void,void,void,void,void,void,void,void>>
               (tuple<testing::Matcher<int_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
                *matcher_tuple,
               tuple<int_*,_unsigned_long,_void,_void,_void,_void,_void,_void,_void,_void>
               *value_tuple)

{
  MatcherInterface<int_*> *pMVar1;
  MatcherInterface<unsigned_long> *pMVar2;
  undefined1 uVar3;
  int iVar4;
  
  pMVar1 = (matcher_tuple->f0_).super_MatcherBase<int_*>.impl_.value_;
  iVar4 = (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                    (pMVar1,value_tuple->f0_);
  if ((char)iVar4 == '\0') {
    uVar3 = 0;
  }
  else {
    pMVar2 = (matcher_tuple->f1_).super_MatcherBase<unsigned_long>.impl_.value_;
    iVar4 = (*(pMVar2->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                      (pMVar2,value_tuple->f1_);
    uVar3 = (undefined1)iVar4;
  }
  return (bool)uVar3;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }